

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_scaleStats(uint *table,U32 lastEltIndex,U32 logTarget)

{
  U32 UVar1;
  uint uVar2;
  
  UVar1 = sum_u32(table,(ulong)(lastEltIndex + 1));
  uVar2 = UVar1 >> ((byte)logTarget & 0x1f);
  if (uVar2 < 2) {
    return UVar1;
  }
  UVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> UVar1 == 0; UVar1 = UVar1 - 1) {
    }
  }
  UVar1 = ZSTD_downscaleStats(table,lastEltIndex,UVar1,base_1guaranteed);
  return UVar1;
}

Assistant:

static U32 ZSTD_scaleStats(unsigned* table, U32 lastEltIndex, U32 logTarget)
{
    U32 const prevsum = sum_u32(table, lastEltIndex+1);
    U32 const factor = prevsum >> logTarget;
    DEBUGLOG(5, "ZSTD_scaleStats (nbElts=%u, target=%u)", (unsigned)lastEltIndex+1, (unsigned)logTarget);
    assert(logTarget < 30);
    if (factor <= 1) return prevsum;
    return ZSTD_downscaleStats(table, lastEltIndex, ZSTD_highbit32(factor), base_1guaranteed);
}